

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputHelpString(ostream *fout,string *helpString)

{
  char *pcVar1;
  ostream *poVar2;
  string local_80 [48];
  ulong local_50;
  size_type i;
  size_type pos;
  string oneLine;
  size_type end;
  string *helpString_local;
  ostream *fout_local;
  
  oneLine.field_2._8_8_ = std::__cxx11::string::size();
  if (oneLine.field_2._8_8_ != 0) {
    std::__cxx11::string::string((string *)&pos);
    i = 0;
    for (local_50 = 0; local_50 <= (ulong)oneLine.field_2._8_8_; local_50 = local_50 + 1) {
      if (((local_50 == oneLine.field_2._8_8_) ||
          (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)helpString), *pcVar1 == '\n'))
         || ((0x3b < local_50 - i &&
             (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)helpString), *pcVar1 == ' '))
            )) {
        std::operator<<(fout,"//");
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)helpString);
        if (*pcVar1 == '\n') {
          i = i + 1;
          std::operator<<(fout,"\\n");
        }
        std::__cxx11::string::substr((ulong)local_80,(ulong)helpString);
        std::__cxx11::string::operator=((string *)&pos,local_80);
        std::__cxx11::string::~string(local_80);
        poVar2 = std::operator<<(fout,(string *)&pos);
        std::operator<<(poVar2,"\n");
        i = local_50;
      }
    }
    std::__cxx11::string::~string((string *)&pos);
  }
  return;
}

Assistant:

void cmCacheManager::OutputHelpString(std::ostream& fout,
                                      const std::string& helpString)
{
  std::string::size_type end = helpString.size();
  if (end == 0) {
    return;
  }
  std::string oneLine;
  std::string::size_type pos = 0;
  for (std::string::size_type i = 0; i <= end; i++) {
    if ((i == end) || (helpString[i] == '\n') ||
        ((i - pos >= 60) && (helpString[i] == ' '))) {
      fout << "//";
      if (helpString[pos] == '\n') {
        pos++;
        fout << "\\n";
      }
      oneLine = helpString.substr(pos, i - pos);
      fout << oneLine << "\n";
      pos = i;
    }
  }
}